

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O0

int launchTests(testDescPtr tst)

{
  FILE *__stream;
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  undefined8 uVar5;
  char *pcVar6;
  undefined1 local_b0 [8];
  glob_t globbuf;
  xmlBufferPtr out;
  xmlBufferPtr in;
  xmlCharEncodingHandlerPtr eucJpHandler;
  xmlCharEncodingHandlerPtr ibm1141Handler;
  xmlCharEncodingHandlerPtr ebcdicHandler;
  char *pcStack_38;
  int mem;
  char *error;
  char *result;
  size_t i;
  int err;
  int res;
  testDescPtr tst_local;
  
  i._0_4_ = 0;
  lVar3 = xmlGetCharEncodingHandler(6);
  lVar4 = xmlFindCharEncodingHandler("IBM-1141");
  in = (xmlBufferPtr)xmlGetCharEncodingHandler(0x15);
  if (in != (xmlBufferPtr)0x0) {
    uVar5 = xmlBufferCreateSize(10);
    xmlBufferCCat(uVar5,anon_var_dwarf_248a);
    globbuf.gl_stat = (_func_int_char_ptr_void_ptr *)xmlBufferCreateSize(10);
    iVar1 = xmlCharEncInFunc(in,globbuf.gl_stat,uVar5);
    if (iVar1 != 3) {
      xmlCharEncCloseFunc(in);
      in = (xmlBufferPtr)0x0;
    }
    xmlBufferFree(globbuf.gl_stat);
    xmlBufferFree(uVar5);
  }
  if (tst == (testDescPtr)0x0) {
    tst_local._4_4_ = 0xffffffff;
  }
  else {
    if (tst->in == (char *)0x0) {
      testErrorsSize = 0;
      testErrors[0] = '\0';
      iVar1 = (*tst->func)((char *)0x0,(char *)0x0,(char *)0x0,tst->options);
      xmlResetLastError();
      if (iVar1 != 0) {
        nb_errors = nb_errors + 1;
      }
      i._0_4_ = (uint)(iVar1 != 0);
    }
    else {
      globbuf.gl_pathv = (char **)0x0;
      glob64(tst->in,8,(__errfunc *)0x0,(glob64_t *)local_b0);
      for (result = (char *)0x0; result < (ulong)local_b0; result = result + 1) {
        iVar1 = checkTestFile(*(char **)(globbuf.gl_pathc + (long)result * 8));
        if (((iVar1 != 0) &&
            (((lVar3 != 0 && (lVar4 != 0)) ||
             (pcVar6 = strstr(*(char **)(globbuf.gl_pathc + (long)result * 8),"ebcdic"),
             pcVar6 == (char *)0x0)))) &&
           ((in != (xmlBufferPtr)0x0 ||
            (pcVar6 = strstr(*(char **)(globbuf.gl_pathc + (long)result * 8),"icu_parse_test"),
            pcVar6 == (char *)0x0)))) {
          if (tst->suffix == (char *)0x0) {
            error = (char *)0x0;
          }
          else {
            error = resultFilename(*(char **)(globbuf.gl_pathc + (long)result * 8),tst->out,
                                   tst->suffix);
            if (error == (char *)0x0) {
              fprintf(_stderr,"Out of memory !\n");
              fatalError();
            }
          }
          if (tst->err == (char *)0x0) {
            pcStack_38 = (char *)0x0;
          }
          else {
            pcStack_38 = resultFilename(*(char **)(globbuf.gl_pathc + (long)result * 8),tst->out,
                                        tst->err);
            if (pcStack_38 == (char *)0x0) {
              fprintf(_stderr,"Out of memory !\n");
              fatalError();
            }
          }
          iVar1 = xmlMemUsed();
          testErrorsSize = 0;
          testErrors[0] = '\0';
          iVar2 = (*tst->func)(*(char **)(globbuf.gl_pathc + (long)result * 8),error,pcStack_38,
                               tst->options | 0x10000);
          xmlResetLastError();
          if (iVar2 == 0) {
            iVar2 = xmlMemUsed();
            __stream = _stderr;
            if (iVar2 != iVar1) {
              uVar5 = *(undefined8 *)(globbuf.gl_pathc + (long)result * 8);
              iVar2 = xmlMemUsed();
              fprintf(__stream,"File %s leaked %d bytes\n",uVar5,(ulong)(uint)(iVar2 - iVar1));
              nb_leaks = nb_leaks + 1;
              i._0_4_ = (uint)i + 1;
            }
          }
          else {
            fprintf(_stderr,"File %s generated an error\n",
                    *(undefined8 *)(globbuf.gl_pathc + (long)result * 8));
            nb_errors = nb_errors + 1;
            i._0_4_ = (uint)i + 1;
          }
          testErrorsSize = 0;
          if (error != (char *)0x0) {
            free(error);
          }
          if (pcStack_38 != (char *)0x0) {
            free(pcStack_38);
          }
        }
      }
      globfree64((glob64_t *)local_b0);
    }
    xmlCharEncCloseFunc(lVar3);
    xmlCharEncCloseFunc(lVar4);
    xmlCharEncCloseFunc(in);
    tst_local._4_4_ = (uint)i;
  }
  return tst_local._4_4_;
}

Assistant:

static int
launchTests(testDescPtr tst) {
    int res = 0, err = 0;
    size_t i;
    char *result;
    char *error;
    int mem;
    xmlCharEncodingHandlerPtr ebcdicHandler, ibm1141Handler, eucJpHandler;

    ebcdicHandler = xmlGetCharEncodingHandler(XML_CHAR_ENCODING_EBCDIC);
    ibm1141Handler = xmlFindCharEncodingHandler("IBM-1141");

    /*
     * When decoding EUC-JP, musl doesn't seem to support 0x8F control
     * codes.
     */
    eucJpHandler = xmlGetCharEncodingHandler(XML_CHAR_ENCODING_EUC_JP);
    if (eucJpHandler != NULL) {
        xmlBufferPtr in, out;

        in = xmlBufferCreateSize(10);
        xmlBufferCCat(in, "\x8f\xe9\xae");
        out = xmlBufferCreateSize(10);
        if (xmlCharEncInFunc(eucJpHandler, out, in) != 3) {
            xmlCharEncCloseFunc(eucJpHandler);
            eucJpHandler = NULL;
        }
        xmlBufferFree(out);
        xmlBufferFree(in);
    }

    if (tst == NULL) return(-1);
    if (tst->in != NULL) {
	glob_t globbuf;

	globbuf.gl_offs = 0;
	glob(tst->in, GLOB_DOOFFS, NULL, &globbuf);
	for (i = 0;i < globbuf.gl_pathc;i++) {
	    if (!checkTestFile(globbuf.gl_pathv[i]))
	        continue;
            if ((((ebcdicHandler == NULL) || (ibm1141Handler == NULL)) &&
                 (strstr(globbuf.gl_pathv[i], "ebcdic") != NULL)) ||
                ((eucJpHandler == NULL) &&
                 (strstr(globbuf.gl_pathv[i], "icu_parse_test") != NULL)))
                continue;
#if !defined(LIBXML_ICONV_ENABLED) && !defined(LIBXML_ICU_ENABLED) && \
    !defined(LIBXML_ISO8859X_ENABLED)
            if (strstr(globbuf.gl_pathv[i], "iso-8859-5") != NULL)
                continue;
#endif
	    if (tst->suffix != NULL) {
		result = resultFilename(globbuf.gl_pathv[i], tst->out,
					tst->suffix);
		if (result == NULL) {
		    fprintf(stderr, "Out of memory !\n");
		    fatalError();
		}
	    } else {
	        result = NULL;
	    }
	    if (tst->err != NULL) {
		error = resultFilename(globbuf.gl_pathv[i], tst->out,
		                        tst->err);
		if (error == NULL) {
		    fprintf(stderr, "Out of memory !\n");
		    fatalError();
		}
	    } else {
	        error = NULL;
	    }
            mem = xmlMemUsed();
            testErrorsSize = 0;
            testErrors[0] = 0;
            res = tst->func(globbuf.gl_pathv[i], result, error,
                            tst->options | XML_PARSE_COMPACT);
            xmlResetLastError();
            if (res != 0) {
                fprintf(stderr, "File %s generated an error\n",
                        globbuf.gl_pathv[i]);
                nb_errors++;
                err++;
            }
            else if (xmlMemUsed() != mem) {
                fprintf(stderr, "File %s leaked %d bytes\n",
                        globbuf.gl_pathv[i], xmlMemUsed() - mem);
                nb_leaks++;
                err++;
            }
            testErrorsSize = 0;
	    if (result)
		free(result);
	    if (error)
		free(error);
	}
	globfree(&globbuf);
    } else {
        testErrorsSize = 0;
	testErrors[0] = 0;
        res = tst->func(NULL, NULL, NULL, tst->options);
        xmlResetLastError();
	if (res != 0) {
	    nb_errors++;
	    err++;
	}
    }

    xmlCharEncCloseFunc(ebcdicHandler);
    xmlCharEncCloseFunc(ibm1141Handler);
    xmlCharEncCloseFunc(eucJpHandler);

    return(err);
}